

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

wchar_t cmp_u16n(uint16_t *a,uint16_t *b,size_t na,size_t nb)

{
  uint16_t *puVar1;
  ushort uVar2;
  ushort uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar4 = na - nb;
  if (na < nb) {
    uVar5 = nb - na;
    uVar4 = 0;
    uVar6 = 0;
    while (uVar5 != uVar6) {
      puVar1 = b + uVar6;
      uVar6 = uVar6 + 1;
      if (*puVar1 != 0) {
        return L'\xffffffff';
      }
    }
  }
  else {
    uVar5 = 0;
    uVar6 = 0;
    while (uVar4 != uVar6) {
      puVar1 = a + uVar6;
      uVar6 = uVar6 + 1;
      if (*puVar1 != 0) {
        return L'\x01';
      }
    }
  }
  while( true ) {
    if (na <= uVar4) {
      return L'\0';
    }
    if (nb <= uVar5) {
      __assert_fail("ib < nb",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x462,"int cmp_u16n(const uint16_t *, const uint16_t *, size_t, size_t)");
    }
    uVar2 = b[uVar5];
    uVar3 = a[uVar4];
    if (uVar3 >= uVar2 && uVar3 != uVar2) {
      return L'\x01';
    }
    if (uVar3 < uVar2) break;
    uVar4 = uVar4 + 1;
    uVar5 = uVar5 + 1;
  }
  return L'\xffffffff';
}

Assistant:

static int cmp_u16n(const uint16_t *a, const uint16_t *b, size_t na, size_t nb)
{
	size_t ia = 0, ib = 0;

	if (na >= nb) {
		while (ia < na - nb) {
			if (a[ia]) {
				return 1;
			}
			++ia;
		}
	} else {
		while (ib < nb - na) {
			if (b[ib]) {
				return -1;
			}
			++ib;
		}
	}
	while (ia < na) {
		assert(ib < nb);
		if (a[ia] > b[ib]) {
			return 1;
		}
		if (a[ia] < b[ib]) {
			return -1;
		}
		++ia;
		++ib;
	}
	return 0;
}